

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsa_GetStreamOutputCard(PaStream *s,int *card)

{
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  PaError PVar4;
  undefined1 *__s;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  PaAlsaStream *local_30;
  PaAlsaStream *stream;
  
  uStack_40 = 0x10f2f6;
  GetAlsaStreamPointer(s,&local_30);
  paUtilErr_ = 0;
  if ((local_30->playback).pcm == (snd_pcm_t *)0x0) {
    uStack_40 = 0x10f376;
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4625\n"
                     );
    PVar4 = -0x2701;
  }
  else {
    uStack_40 = 0x10f313;
    __n = snd_pcm_info_sizeof();
    lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = auStack_38 + lVar2;
    *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10f334;
    memset(__s,0,__n);
    psVar1 = (local_30->playback).pcm;
    *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10f344;
    paUtilErr_ = snd_pcm_info(psVar1,__s);
    if (paUtilErr_ < 0) {
      *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10f38c;
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_info( stream->playback.pcm, pcmInfo )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4628\n"
                       );
      PVar4 = paUtilErr_;
    }
    else {
      *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10f356;
      iVar3 = snd_pcm_info_get_card(__s);
      *card = iVar3;
      PVar4 = 0;
    }
  }
  return PVar4;
}

Assistant:

PaError PaAlsa_GetStreamOutputCard( PaStream* s, int* card )
{
    PaAlsaStream *stream;
    PaError result = paNoError;
    snd_pcm_info_t* pcmInfo;

    PA_ENSURE( GetAlsaStreamPointer( s, &stream ) );

    /* XXX: More descriptive error? */
    PA_UNLESS( stream->playback.pcm, paDeviceUnavailable );

    alsa_snd_pcm_info_alloca( &pcmInfo );
    PA_ENSURE( alsa_snd_pcm_info( stream->playback.pcm, pcmInfo ) );
    *card = alsa_snd_pcm_info_get_card( pcmInfo );

error:
    return result;
}